

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiReturn __thiscall Assimp::Importer::UnregisterPPStep(Importer *this,BaseProcess *pImp)

{
  BaseProcess **ppBVar1;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  __position;
  Logger *pLVar2;
  aiReturn aVar3;
  BaseProcess *local_20;
  
  if (pImp == (BaseProcess *)0x0) {
    aVar3 = aiReturn_SUCCESS;
  }
  else {
    local_20 = pImp;
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<Assimp::BaseProcess**,std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::BaseProcess*const>>
                           ((this->pimpl->mPostProcessingSteps).
                            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->pimpl->mPostProcessingSteps).
                            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_20);
    ppBVar1 = (this->pimpl->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current == ppBVar1) {
      pLVar2 = DefaultLogger::get();
      Logger::warn(pLVar2,"Unable to remove custom post-processing step: I can\'t find you ..");
    }
    else {
      std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::erase
                (&this->pimpl->mPostProcessingSteps,(const_iterator)__position._M_current);
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"Unregistering custom post-processing step");
    }
    aVar3 = -(uint)(__position._M_current == ppBVar1);
  }
  return aVar3;
}

Assistant:

aiReturn Importer::UnregisterPPStep(BaseProcess* pImp)
{
    if(!pImp) {
        // unregistering a NULL ppstep is no problem for us ... really!
        return AI_SUCCESS;
    }

    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::vector<BaseProcess*>::iterator it = std::find(pimpl->mPostProcessingSteps.begin(),
        pimpl->mPostProcessingSteps.end(),pImp);

    if (it != pimpl->mPostProcessingSteps.end())    {
        pimpl->mPostProcessingSteps.erase(it);
        ASSIMP_LOG_INFO("Unregistering custom post-processing step");
        return AI_SUCCESS;
    }
    ASSIMP_LOG_WARN("Unable to remove custom post-processing step: I can't find you ..");
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_FAILURE;
}